

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xml_document::_destroy(xml_document *this)

{
  long *in_RDI;
  xml_memory_page *next;
  xml_memory_page *page;
  xml_memory_page *root_page;
  xml_extra_buffer *extra;
  long local_20;
  long *local_10;
  
  if (in_RDI[1] != 0) {
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (in_RDI[1]);
    in_RDI[1] = 0;
  }
  for (local_10 = *(long **)(*in_RDI + 0x58); local_10 != (long *)0x0;
      local_10 = (long *)local_10[1]) {
    if (*local_10 != 0) {
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )(*local_10);
    }
  }
  local_20 = *(long *)((*in_RDI - (*(ulong *)*in_RDI >> 8)) + 0x10);
  while (local_20 != 0) {
    local_20 = *(long *)(local_20 + 0x10);
    impl::anon_unknown_0::xml_allocator::deallocate_page((xml_memory_page *)0x12655d);
  }
  *in_RDI = 0;
  return;
}

Assistant:

PUGI__FN void xml_document::_destroy()
	{
		assert(_root);

		// destroy static storage
		if (_buffer)
		{
			impl::xml_memory::deallocate(_buffer);
			_buffer = 0;
		}

		// destroy extra buffers (note: no need to destroy linked list nodes, they're allocated using document allocator)
		for (impl::xml_extra_buffer* extra = static_cast<impl::xml_document_struct*>(_root)->extra_buffers; extra; extra = extra->next)
		{
			if (extra->buffer) impl::xml_memory::deallocate(extra->buffer);
		}

		// destroy dynamic storage, leave sentinel page (it's in static memory)
		impl::xml_memory_page* root_page = PUGI__GETPAGE(_root);
		assert(root_page && !root_page->prev);
		assert(reinterpret_cast<char*>(root_page) >= _memory && reinterpret_cast<char*>(root_page) < _memory + sizeof(_memory));

		for (impl::xml_memory_page* page = root_page->next; page; )
		{
			impl::xml_memory_page* next = page->next;

			impl::xml_allocator::deallocate_page(page);

			page = next;
		}

	#ifdef PUGIXML_COMPACT
		// destroy hash table
		static_cast<impl::xml_document_struct*>(_root)->hash.clear();
	#endif

		_root = 0;
	}